

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssert.hpp
# Opt level: O0

string * __thiscall
cppassert::CppAssertT<cppassert::DefaultFormatter,_std::mutex,_cppassert::DefaultHandler>::
formatPredicateFailureMessage
          (string *__return_storage_ptr__,
          CppAssertT<cppassert::DefaultFormatter,_std::mutex,_cppassert::DefaultHandler> *this,
          char *predicate,char *value1AsText,char *value2AsText,string *value1,string *value2)

{
  string *value1_local;
  char *value2AsText_local;
  char *value1AsText_local;
  char *predicate_local;
  CppAssertT<cppassert::DefaultFormatter,_std::mutex,_cppassert::DefaultHandler> *this_local;
  
  DefaultFormatter::formatPredicateFailureMessage
            (__return_storage_ptr__,(DefaultFormatter *)this,predicate,value1AsText,value2AsText,
             value1,value2);
  return __return_storage_ptr__;
}

Assistant:

std::string CppAssertT<Formatter, LockingPolicy, AssertionHandler>::formatPredicateFailureMessage(const char* predicate,
                                const char* value1AsText,
                                const char* value2AsText,
                                const std::string &value1,
                                const std::string &value2)
{
    return formatter_.formatPredicateFailureMessage(predicate
                        , value1AsText
                        , value2AsText
                        , value1
                        , value2);
}